

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_ExtractChannel(ExtractChannelForm1 ExtractChannel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image output;
  Image input;
  
  Unit_Test::intensityArray(&intensity,3);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&input,value,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  Unit_Test::fillImage(&input,0,0,input._width,input._height,&intensity);
  uVar2 = rand();
  (*ExtractChannel)(&output,&input,(uint8_t)((ulong)uVar2 % 3));
  bVar1 = Unit_Test::verifyImage
                    (&output,intensity.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[(ulong)uVar2 % 3]);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1 && output._colorCount == '\x01';
}

Assistant:

bool form1_ExtractChannel(ExtractChannelForm1 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        const PenguinV_Image::Image output = ExtractChannel( input, channelId );

        return verifyImage( output, intensity[channelId] ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }